

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_resume_data(nghttp2_session *session,int32_t stream_id)

{
  int iVar1;
  nghttp2_stream *stream_00;
  nghttp2_stream *stream;
  int rv;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  stream_00 = nghttp2_session_get_stream(session,stream_id);
  if ((stream_00 == (nghttp2_stream *)0x0) ||
     (iVar1 = nghttp2_stream_check_deferred_item(stream_00), iVar1 == 0)) {
    session_local._4_4_ = -0x1f5;
  }
  else {
    session_local._4_4_ = session_resume_deferred_stream_item(session,stream_00,'\b');
    iVar1 = nghttp2_is_fatal(session_local._4_4_);
    if (iVar1 == 0) {
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_resume_data(nghttp2_session *session, int32_t stream_id) {
  int rv;
  nghttp2_stream *stream;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL || !nghttp2_stream_check_deferred_item(stream)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  rv = session_resume_deferred_stream_item(session, stream,
                                           NGHTTP2_STREAM_FLAG_DEFERRED_USER);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}